

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::text::render_value(text *this,form_context *context)

{
  bool bVar1;
  ostream *poVar2;
  long *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string local_50 [16];
  form_context *in_stack_ffffffffffffffc0;
  string local_30 [8];
  base_text *in_stack_ffffffffffffffd8;
  
  bVar1 = base_widget::set((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if (bVar1) {
    poVar2 = form_context::out(in_stack_ffffffffffffffc0);
    poVar2 = std::operator<<(poVar2," value=\"");
    base_text::value_abi_cxx11_(in_stack_ffffffffffffffd8);
    util::escape(in_stack_ffffffffffffffa8);
    poVar2 = std::operator<<(poVar2,local_30);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void text::render_value(form_context &context)
{
	if(set()) {
		context.out() << " value=\"" << util::escape(value()) << "\"";
	}
}